

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char sqlite3CompareAffinity(Expr *pExpr,char aff2)

{
  byte bVar1;
  byte bVar2;
  undefined3 in_register_00000031;
  
  bVar1 = sqlite3ExprAffinity(pExpr);
  if (CONCAT31(in_register_00000031,aff2) == 0 || bVar1 == 0) {
    bVar2 = 0x41;
    if (bVar1 != 0 || aff2 != '\0') {
      bVar2 = bVar1 + aff2;
    }
  }
  else {
    bVar2 = 0x43;
    if ((byte)aff2 < 0x43) {
      bVar2 = (0x42 < bVar1) * '\x02' | 0x41;
    }
  }
  return bVar2;
}

Assistant:

SQLITE_PRIVATE char sqlite3CompareAffinity(Expr *pExpr, char aff2){
  char aff1 = sqlite3ExprAffinity(pExpr);
  if( aff1 && aff2 ){
    /* Both sides of the comparison are columns. If one has numeric
    ** affinity, use that. Otherwise use no affinity.
    */
    if( sqlite3IsNumericAffinity(aff1) || sqlite3IsNumericAffinity(aff2) ){
      return SQLITE_AFF_NUMERIC;
    }else{
      return SQLITE_AFF_BLOB;
    }
  }else if( !aff1 && !aff2 ){
    /* Neither side of the comparison is a column.  Compare the
    ** results directly.
    */
    return SQLITE_AFF_BLOB;
  }else{
    /* One side is a column, the other is not. Use the columns affinity. */
    assert( aff1==0 || aff2==0 );
    return (aff1 + aff2);
  }
}